

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalAsOfJoin::PhysicalAsOfJoin
          (PhysicalAsOfJoin *this,LogicalComparisonJoin *op,PhysicalOperator *left,
          PhysicalOperator *right)

{
  bool bVar1;
  pointer pEVar2;
  undefined8 uVar3;
  reference this_00;
  PhysicalOperator *this_01;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_02;
  size_type sVar4;
  undefined8 *in_RDI;
  column_t i;
  size_type right_count;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> right_1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> left_1;
  JoinCondition *cond;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::JoinCondition,_true> *__range1;
  PhysicalOperator *in_stack_fffffffffffffe38;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_fffffffffffffe50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_03;
  OrderType *in_stack_fffffffffffffe58;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  *in_stack_fffffffffffffe60;
  idx_t in_stack_fffffffffffffe68;
  undefined1 *__n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe70;
  vector<duckdb::JoinCondition,_true> *in_stack_fffffffffffffe78;
  allocator *paVar5;
  undefined8 in_stack_fffffffffffffe80;
  PhysicalOperatorType type;
  LogicalOperator *in_stack_fffffffffffffe88;
  PhysicalComparisonJoin *in_stack_fffffffffffffe90;
  ulong local_e8;
  undefined1 local_d0 [14];
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  size_type local_a0;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  size_type local_90;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  size_type local_80;
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  reference local_68;
  JoinCondition *local_60;
  __normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
  local_58;
  undefined8 *local_50;
  
  type = (PhysicalOperatorType)((ulong)in_stack_fffffffffffffe80 >> 0x38);
  vector<duckdb::JoinCondition,_true>::vector
            ((vector<duckdb::JoinCondition,_true> *)in_stack_fffffffffffffe40,
             (vector<duckdb::JoinCondition,_true> *)in_stack_fffffffffffffe38);
  PhysicalComparisonJoin::PhysicalComparisonJoin
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,type,in_stack_fffffffffffffe78,
             (JoinType)((ulong)in_stack_fffffffffffffe70 >> 0x38),in_stack_fffffffffffffe68);
  vector<duckdb::JoinCondition,_true>::~vector((vector<duckdb::JoinCondition,_true> *)0x17fc515);
  *in_RDI = &PTR__PhysicalAsOfJoin_0352c128;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x17fc53f);
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x17fc55b);
  *(undefined1 *)(in_RDI + 0x1b) = 0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)0x17fc57e);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)0x17fc59a);
  vector<duckdb::BoundOrderByNode,_true>::vector
            ((vector<duckdb::BoundOrderByNode,_true> *)0x17fc5b6);
  vector<duckdb::BoundOrderByNode,_true>::vector
            ((vector<duckdb::BoundOrderByNode,_true> *)0x17fc5d2);
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x17fc5ee);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffe40,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffe38);
  local_50 = in_RDI + 0x11;
  local_58._M_current =
       (JoinCondition *)
       ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::begin
                 ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
                  in_stack_fffffffffffffe38);
  local_60 = (JoinCondition *)
             ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::end
                       ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
                        in_stack_fffffffffffffe38);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) {
      __n = local_d0;
      ::std::reference_wrapper<duckdb::PhysicalOperator>::
      reference_wrapper<duckdb::PhysicalOperator&,void,duckdb::PhysicalOperator*>
                ((reference_wrapper<duckdb::PhysicalOperator> *)in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38);
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ::push_back(in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
      this_03 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 2);
      ::std::reference_wrapper<duckdb::PhysicalOperator>::
      reference_wrapper<duckdb::PhysicalOperator&,void,duckdb::PhysicalOperator*>
                ((reference_wrapper<duckdb::PhysicalOperator> *)in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38);
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ::push_back(in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
      vector<unsigned_long,_true>::operator=
                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffe40,
                 (vector<unsigned_long,_true> *)in_stack_fffffffffffffe38);
      bVar1 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(this_03);
      if (bVar1) {
        this_00 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                             in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
        this_01 = ::std::reference_wrapper<duckdb::PhysicalOperator>::get(this_00);
        this_02 = &PhysicalOperator::GetTypes(this_01)->
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
        sVar4 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                          (this_02);
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  (in_stack_fffffffffffffe70,(size_type)__n);
        for (local_e8 = 0; local_e8 < sVar4; local_e8 = local_e8 + 1) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                    (this_03,(unsigned_long *)this_00);
        }
      }
      return;
    }
    local_68 = __gnu_cxx::
               __normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
               ::operator*(&local_58);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe40);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe40);
    (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0x11])(local_70);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe40);
    (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0x11])(local_78);
    switch(local_68->comparison) {
    case COMPARE_BOUNDARY_START:
      local_a0 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ::size((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         *)(in_RDI + 0x22));
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
                 (unsigned_long *)in_stack_fffffffffffffe48);
    case COMPARE_BOUNDARY_END:
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)in_stack_fffffffffffffe50,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe48);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)in_stack_fffffffffffffe50,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe48);
      break;
    default:
      local_c2 = 1;
      uVar3 = __cxa_allocate_exception(0x10);
      paVar5 = &local_c1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c0,"Unsupported join condition for ASOF join",paVar5);
      NotImplementedException::NotImplementedException
                ((NotImplementedException *)in_stack_fffffffffffffe40,
                 (string *)in_stack_fffffffffffffe38);
      local_c2 = 0;
      __cxa_throw(uVar3,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    case COMPARE_LESSTHAN:
    case COMPARE_LESSTHANOREQUALTO:
      local_90 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ::size((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         *)(in_RDI + 0x22));
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
                 (unsigned_long *)in_stack_fffffffffffffe48);
      local_91 = 3;
      local_92 = 3;
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (OrderByNullType *)in_stack_fffffffffffffe50,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe48);
      local_93 = 3;
      local_94 = 3;
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (OrderByNullType *)in_stack_fffffffffffffe50,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe48);
      *(ExpressionType *)(in_RDI + 0x1b) = local_68->comparison;
      break;
    case COMPARE_GREATERTHAN:
    case COMPARE_GREATERTHANOREQUALTO:
      local_80 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ::size((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         *)(in_RDI + 0x22));
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
                 (unsigned_long *)in_stack_fffffffffffffe48);
      local_81 = 2;
      local_82 = 3;
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (OrderByNullType *)in_stack_fffffffffffffe50,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe48);
      local_83 = 2;
      local_84 = 3;
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (OrderByNullType *)in_stack_fffffffffffffe50,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe48);
      *(ExpressionType *)(in_RDI + 0x1b) = local_68->comparison;
    }
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0x17fcaed);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0x17fcafa);
    __gnu_cxx::
    __normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

PhysicalAsOfJoin::PhysicalAsOfJoin(LogicalComparisonJoin &op, PhysicalOperator &left, PhysicalOperator &right)
    : PhysicalComparisonJoin(op, PhysicalOperatorType::ASOF_JOIN, std::move(op.conditions), op.join_type,
                             op.estimated_cardinality),
      comparison_type(ExpressionType::INVALID), predicate(std::move(op.predicate)) {

	// Convert the conditions partitions and sorts
	for (auto &cond : conditions) {
		D_ASSERT(cond.left->return_type == cond.right->return_type);
		join_key_types.push_back(cond.left->return_type);

		auto left = cond.left->Copy();
		auto right = cond.right->Copy();
		switch (cond.comparison) {
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		case ExpressionType::COMPARE_GREATERTHAN:
			null_sensitive.emplace_back(lhs_orders.size());
			lhs_orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(left));
			rhs_orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(right));
			comparison_type = cond.comparison;
			break;
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		case ExpressionType::COMPARE_LESSTHAN:
			//	Always put NULLS LAST so they can be ignored.
			null_sensitive.emplace_back(lhs_orders.size());
			lhs_orders.emplace_back(OrderType::DESCENDING, OrderByNullType::NULLS_LAST, std::move(left));
			rhs_orders.emplace_back(OrderType::DESCENDING, OrderByNullType::NULLS_LAST, std::move(right));
			comparison_type = cond.comparison;
			break;
		case ExpressionType::COMPARE_EQUAL:
			null_sensitive.emplace_back(lhs_orders.size());
			DUCKDB_EXPLICIT_FALLTHROUGH;
		case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
			lhs_partitions.emplace_back(std::move(left));
			rhs_partitions.emplace_back(std::move(right));
			break;
		default:
			throw NotImplementedException("Unsupported join condition for ASOF join");
		}
	}
	D_ASSERT(!lhs_orders.empty());
	D_ASSERT(!rhs_orders.empty());

	children.push_back(left);
	children.push_back(right);

	//	Fill out the right projection map.
	right_projection_map = op.right_projection_map;
	if (right_projection_map.empty()) {
		const auto right_count = children[1].get().GetTypes().size();
		right_projection_map.reserve(right_count);
		for (column_t i = 0; i < right_count; ++i) {
			right_projection_map.emplace_back(i);
		}
	}
}